

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O0

void __thiscall MIDI::MidiInput::~MidiInput(MidiInput *this)

{
  MidiInput *this_local;
  
  return;
}

Assistant:

MidiInput::~MidiInput()
    {
    #if PLATFORM_WIN
        if (m_midihandle)
        {
            midiInStop(m_midihandle);
            midiInClose(m_midihandle);
        }
    #elif PLATFORM_OSX
        // TODO
    #endif
    }